

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Vec_Int_t * Saig_RefManFindReason(Saig_RefMan_t *p)

{
  undefined1 *puVar1;
  Abc_Cex_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  Vec_Int_t *vPrios;
  int *piVar6;
  long lVar7;
  Vec_Int_t *vReasons;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  Aig_Obj_t *pObj;
  long lVar15;
  uint uVar16;
  byte bVar17;
  uint uVar18;
  Aig_Man_t *pAVar19;
  
  iVar14 = p->pAig->nTruePis;
  iVar13 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar13 = iVar14;
  }
  if (iVar13 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)iVar13 << 2);
  }
  if (pvVar5 != (void *)0x0) {
    memset(pvVar5,0xff,(long)iVar14 * 4);
  }
  pAVar19 = p->pFrames;
  iVar13 = pAVar19->vObjs->nSize;
  vPrios = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar8 = iVar13;
  }
  vPrios->nSize = 0;
  vPrios->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  vPrios->pArray = piVar6;
  vPrios->nSize = iVar13;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,(long)iVar13 << 2);
  }
  puVar1 = &pAVar19->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  pVVar9 = p->pFrames->vCis;
  if (0 < pVVar9->nSize) {
    lVar7 = 0;
    lVar11 = 0;
    iVar13 = 0;
    do {
      lVar15 = (long)p->vMapPiF2A->nSize;
      if ((lVar15 <= lVar7) || (lVar15 <= lVar7 + 1)) goto LAB_00609ded;
      piVar6 = p->vMapPiF2A->pArray;
      pAVar2 = p->pCex;
      uVar18 = piVar6[lVar7];
      iVar8 = pAVar2->nRegs + uVar18 + pAVar2->nPis * piVar6[lVar7 + 1];
      lVar15 = *(long *)((long)pVVar9->pArray + lVar7 * 4);
      *(ulong *)(lVar15 + 0x18) =
           (*(ulong *)(lVar15 + 0x18) & 0xfffffffffffffff7) +
           (ulong)((uint)(&pAVar2[1].iPo)[iVar8 >> 5] >> ((byte)iVar8 & 0x1f) & 1) * 8;
      if (((int)uVar18 < 0) || (iVar14 <= (int)uVar18)) goto LAB_00609ded;
      if (*(int *)((long)pvVar5 + (ulong)uVar18 * 4) == -1) {
        *(int *)((long)pvVar5 + (ulong)uVar18 * 4) = iVar13;
        iVar13 = iVar13 + 1;
      }
      iVar8 = *(int *)(lVar15 + 0x24);
      if (((long)iVar8 < 0) || (vPrios->nSize <= iVar8)) goto LAB_00609e0c;
      vPrios->pArray[iVar8] = (int)lVar11;
      lVar11 = lVar11 + 1;
      pVVar9 = p->pFrames->vCis;
      lVar7 = lVar7 + 2;
    } while (lVar11 < pVVar9->nSize);
  }
  if (pvVar5 != (void *)0x0) {
    free(pvVar5);
  }
  pAVar19 = p->pFrames;
  pVVar9 = pAVar19->vObjs;
  if (0 < pVVar9->nSize) {
    lVar7 = 0;
    do {
      pvVar5 = pVVar9->pArray[lVar7];
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7))
      {
        uVar3 = *(ulong *)((long)pvVar5 + 8);
        if (uVar3 == 0) {
          uVar18 = 0xffffffff;
        }
        else {
          uVar18 = *(uint *)((uVar3 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar18 < 0) || (vPrios->nSize <= (int)uVar18)) {
LAB_00609ded:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = *(ulong *)((long)pvVar5 + 0x10);
        if (uVar4 == 0) {
          uVar12 = 0xffffffff;
        }
        else {
          uVar12 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar12 < 0) || (vPrios->nSize <= (int)uVar12)) goto LAB_00609ded;
        uVar10 = (uint)uVar3 & 1;
        uVar16 = *(uint *)((uVar3 & 0xfffffffffffffffe) + 0x18) >> 3 & 1;
        iVar14 = vPrios->pArray[uVar18];
        iVar13 = vPrios->pArray[uVar12];
        uVar18 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x18) >> 3 ^ (uint)uVar4;
        bVar17 = (byte)uVar18 & uVar10 != uVar16;
        *(ulong *)((long)pvVar5 + 0x18) =
             (*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffff7) + (ulong)bVar17 * 8;
        if (bVar17 == 1) {
          uVar12 = *(uint *)((long)pvVar5 + 0x24);
          if ((int)uVar12 < 0) {
LAB_00609e0c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          if (iVar14 <= iVar13) {
            iVar14 = iVar13;
          }
        }
        else {
          uVar18 = uVar18 & 1;
          if ((uVar10 == uVar16) && (uVar18 != 0)) {
            uVar12 = *(uint *)((long)pvVar5 + 0x24);
            iVar13 = iVar14;
          }
          else {
            uVar12 = *(uint *)((long)pvVar5 + 0x24);
            if ((uVar10 == uVar16) || (uVar18 != 0)) {
              if (-1 < (int)uVar12) {
                if (iVar13 <= iVar14) {
                  iVar14 = iVar13;
                }
                goto LAB_00609d15;
              }
              goto LAB_00609e0c;
            }
          }
          iVar14 = iVar13;
          if ((int)uVar12 < 0) goto LAB_00609e0c;
        }
LAB_00609d15:
        if (vPrios->nSize <= (int)uVar12) goto LAB_00609e0c;
        vPrios->pArray[uVar12] = iVar14;
      }
      lVar7 = lVar7 + 1;
      pAVar19 = p->pFrames;
      pVVar9 = pAVar19->vObjs;
    } while (lVar7 < pVVar9->nSize);
  }
  if (pAVar19->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar5 = *pAVar19->vCos->pArray;
  uVar3 = *(ulong *)((long)pvVar5 + 8);
  if ((((uint)uVar3 ^ *(uint *)((uVar3 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0) {
    __assert_fail("(int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                  ,0xd5,"Vec_Int_t *Saig_RefManFindReason(Saig_RefMan_t *)");
  }
  vReasons = (Vec_Int_t *)malloc(0x10);
  vReasons->nCap = 100;
  vReasons->nSize = 0;
  piVar6 = (int *)malloc(400);
  vReasons->pArray = piVar6;
  Aig_ManIncrementTravId(pAVar19);
  pObj = (Aig_Obj_t *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe);
  if ((*(uint *)&pObj->field_0x18 & 7) != 1) {
    Saig_RefManFindReason_rec(p->pFrames,pObj,vPrios,vReasons);
  }
  if (vPrios->pArray != (int *)0x0) {
    free(vPrios->pArray);
    vPrios->pArray = (int *)0x0;
  }
  free(vPrios);
  return vReasons;
}

Assistant:

Vec_Int_t * Saig_RefManFindReason( Saig_RefMan_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vPi2Prio, * vReasons;
    int i, CountPrios;

    vPi2Prio = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    vPrios   = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );

    // set PI values according to CEX
    CountPrios = 0;
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        // assign priority
        if ( Vec_IntEntry(vPi2Prio, iInput) == ~0 )
            Vec_IntWriteEntry( vPi2Prio, iInput, CountPrios++ );
//        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Vec_IntEntry(vPi2Prio, iInput) );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }
//    printf( "Priority numbers = %d.\n", CountPrios );
    Vec_IntFree( vPi2Prio );

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    assert( (int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj) );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        Saig_RefManFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
    return vReasons;
}